

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O3

RangeList * __thiscall
SoapySDR::Device::getSampleRateRange
          (RangeList *__return_storage_ptr__,Device *this,int direction,size_t channel)

{
  pointer *ppRVar1;
  iterator __position;
  undefined4 in_register_00000014;
  double *bw;
  double *pdVar2;
  Range local_50;
  double *local_38;
  double *local_30;
  
  (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*this->_vptr_Device[0x41])(&local_38,this,CONCAT44(in_register_00000014,direction));
  if (local_38 != local_30) {
    pdVar2 = local_38;
    do {
      Range::Range(&local_50,*pdVar2,*pdVar2,0.0);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>::
        _M_realloc_insert<SoapySDR::Range>(__return_storage_ptr__,__position,&local_50);
      }
      else {
        (__position._M_current)->_step = local_50._step;
        (__position._M_current)->_min = local_50._min;
        (__position._M_current)->_max = local_50._max;
        ppRVar1 = &(__return_storage_ptr__->
                   super__Vector_base<SoapySDR::Range,_std::allocator<SoapySDR::Range>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppRVar1 = *ppRVar1 + 1;
      }
      pdVar2 = pdVar2 + 1;
    } while (pdVar2 != local_30);
  }
  if (local_38 != (double *)0x0) {
    operator_delete(local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

SoapySDR::RangeList SoapySDR::Device::getSampleRateRange(const int direction, const size_t channel) const
{
    SoapySDR::RangeList ranges;
    //call into the older deprecated listSampleRates() call
    for (auto &bw : this->listSampleRates(direction, channel))
    {
        ranges.push_back(SoapySDR::Range(bw, bw));
    }
    return ranges;
}